

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_timeout.cpp
# Opt level: O2

void __thiscall tst_qpromise_timeout::timeout(tst_qpromise_timeout *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  PromiseData<int> *pPVar6;
  QSlotObjectBase *pQVar7;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar8;
  QPromiseReject<int> *in_R8;
  bool failed;
  PromiseResolver<int> resolver_2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_1e0;
  _Any_data local_1d8;
  undefined **local_1c8;
  PromiseData<int> *pPStack_1c0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_1b8;
  QPromiseBase<int> local_1b0;
  QPromiseBase<int> local_1a0;
  QPromise<int> p_1;
  QPromise<int> p;
  QPromiseBase<int> local_168;
  PromiseResolver<int> resolver;
  PromiseResolver<int> resolver_3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> local_128;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_120;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_118;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_110;
  PromiseResolver<void> resolver_1;
  qint64 elapsed;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_d0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_c8;
  _Any_data local_c0 [2];
  undefined **local_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  QPromiseBase<int> local_50;
  QElapsedTimer timer;
  
  timer.t1 = -0x8000000000000000;
  timer.t2 = -0x8000000000000000;
  elapsed = -1;
  failed = false;
  QElapsedTimer::start();
  local_168._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011ba98;
  pPVar6 = (PromiseData<int> *)operator_new(0x68);
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0
  ;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(pPVar6);
  LOCK();
  pQVar1 = &(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1d8._M_unused._M_object = &PTR__QPromiseBase_0011bac8;
  local_1d8._8_8_ = pPVar6;
  local_168.m_d.d = pPVar6;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_1d8);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_1d8);
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_c0[0]._M_unused._M_object = (void *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_120.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_120 = resolver.m_d.d;
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)resolver.m_d.d;
  local_d0 = resolver.m_d.d;
  pQVar7 = (QSlotObjectBase *)operator_new(0x18);
  local_c8.d = local_120.d;
  if (local_120.d == (Data *)0x0) {
    QVar8.d = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    QVar8.d = local_120.d;
  }
  (pQVar7->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar7->m_impl =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp:84:43),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(Data **)(pQVar7 + 1) = QVar8.d;
  if (QVar8.d != (Data *)0x0) {
    LOCK();
    ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QTimer::singleShotImpl(4000,CoarseTimer,(QObject *)0x0,pQVar7);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_c8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_120);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_d0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
             &resolver_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)local_c0)
  ;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_168._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bac8;
  local_a0 = &PTR__QException_0011ba48;
  QtPromise::QPromiseBase<int>::timeout<QtPromise::QPromiseTimeoutException>
            ((QPromiseBase<int> *)&resolver_3,(int)&local_168,(QPromiseTimeoutException *)0x7d0);
  p_1.super_QPromiseBase<int>.m_d.d = local_128.d;
  if (local_128.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_128.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bac8;
  local_1a0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bc70;
  pPVar6 = (PromiseData<int> *)operator_new(0x58);
  (((PromiseDataBase<void,_void_()> *)&pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)->
  m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<void,_void_()> *)&pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)->
  m_catchers).d.size = 0;
  (((PromiseDataBase<void,_void_()> *)&pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)->
  m_handlers).d.size = 0;
  (((PromiseDataBase<void,_void_()> *)&pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)->
  m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<void,_void_()> *)&pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)->
  m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<void,_void_()> *)&pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)->
  m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)
   &((PromiseDataBase<void,_void_()> *)&pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)->
    m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<void,_void_()> *)&pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)->
    m_settled = 0;
  ((PromiseDataBase<void,_void_()> *)&pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)->
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<void,_void_()> *)&pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)->
    super_QSharedData = 0;
  (((PromiseDataBase<void,_void_()> *)&pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)->
  m_error).m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)pPVar6);
  LOCK();
  pQVar1 = &((PromiseDataBase<void,_void_()> *)
            &pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)->super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<void,_void_()> *)
              &pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011bc28;
  local_1a0.m_d.d = pPVar6;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&resolver);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&resolver);
  QVar2 = p_1.super_QPromiseBase<int>.m_d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_1d8._M_unused._M_object = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_1d8._M_unused._0_8_ = (undefined8)resolver_1;
  }
  local_1b0._vptr_QPromiseBase = (_func_int **)0x0;
  if ((Data *)local_1d8._M_unused._0_8_ == (Data *)0x0) {
    resolver_2.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_1d8._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_1d8._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    resolver_2.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
         local_1d8._M_unused._0_8_;
  }
  local_1e0.d = (Data *)0x0;
  if ((Data *)local_1d8._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_1d8._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_1d8._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver_2.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver_2.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_1d8._8_8_ = resolver_2.m_d.d;
  local_1c8 = (undefined **)&elapsed;
  pPStack_1c0 = (PromiseData<int> *)&timer;
  local_c0[0]._0_8_ = local_1d8._M_unused._M_object;
  local_78._M_unused._M_object = operator_new(0x20);
  *(void **)local_78._M_unused._0_8_ = local_1d8._M_unused._M_object;
  if ((Data *)local_1d8._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_1d8._M_unused._0_8_ = *local_1d8._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_1d8._8_8_;
  if ((PromiseData<int> *)local_1d8._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)local_1d8._8_8_ = *(int *)local_1d8._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_78._M_unused._0_8_ + 0x10) = local_1c8;
  *(PromiseData<int> **)((long)local_78._M_unused._0_8_ + 0x18) = pPStack_1c0;
  pcStack_60 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseHandler<int,tst_qpromise_timeout::timeout()::$_1,void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_qpromise_timeout::timeout()::$_1_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)&local_1d8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  QVar2 = p_1.super_QPromiseBase<int>.m_d;
  local_1d8._M_unused._M_object = (void *)local_c0[0]._0_8_;
  if ((Data *)local_c0[0]._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_c0[0]._0_8_ = *(int *)local_c0[0]._0_8_ + 1;
    UNLOCK();
  }
  local_1d8._8_8_ = resolver_2.m_d.d;
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
  }
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_1c8 = (undefined **)&elapsed;
  pPStack_1c0 = (PromiseData<int> *)&timer;
  local_98._M_unused._M_object = operator_new(0x20);
  *(void **)local_98._M_unused._0_8_ = local_1d8._M_unused._M_object;
  if ((Data *)local_1d8._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_1d8._M_unused._0_8_ = *local_1d8._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = local_1d8._8_8_;
  if ((PromiseData<int> *)local_1d8._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)local_1d8._8_8_ = *(int *)local_1d8._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_98._M_unused._0_8_ + 0x10) = local_1c8;
  *(PromiseData<int> **)((long)local_98._M_unused._0_8_ + 0x18) = pPStack_1c0;
  pcStack_80 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseCatcher<int,tst_qpromise_timeout::timeout()::$_1,void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_qpromise_timeout::timeout()::$_1_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&local_1d8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &resolver_2);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_1e0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)local_c0
            );
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_1b0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  local_1a0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bc28;
  bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p_1.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(p_1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
    ;
  }
  local_1b0.m_d.d = p_1.super_QPromiseBase<int>.m_d.d;
  if (p_1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p_1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1b0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bac8;
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011ba98;
  pPVar6 = (PromiseData<int> *)operator_new(0x68);
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0
  ;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar6->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(pPVar6);
  LOCK();
  pQVar1 = &(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011bac8;
  p.super_QPromiseBase<int>.m_d.d = pPVar6;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_2,(QPromise<int> *)&resolver);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&resolver);
  QVar2.d = local_1a0.m_d.d;
  if (resolver_2.m_d.d == (Data *)0x0) {
    local_1e0.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    local_1e0 = resolver_2.m_d.d;
  }
  local_1b8.d = (Data *)0x0;
  if (local_1e0.d == (Data *)0x0) {
    local_1d8._8_8_ = (PromiseData<int> *)0x0;
  }
  else {
    LOCK();
    ((local_1e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_1e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_1d8._8_8_ = local_1e0.d;
  }
  local_118.d = (Data *)0x0;
  if (local_1e0.d != (Data *)0x0) {
    LOCK();
    ((local_1e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_1e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((PromiseData<int> *)local_1d8._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    (((QAtomicInt *)
     &(((PromiseData<int> *)local_1d8._8_8_)->super_PromiseDataBase<int,_void_(const_int_&)>).
      _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (((QAtomicInt *)
          &(((PromiseData<int> *)local_1d8._8_8_)->super_PromiseDataBase<int,_void_(const_int_&)>).
           _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pPStack_1c0 = local_1b0.m_d.d;
  if (local_1b0.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_1b0.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1c8 = &PTR__QPromiseBase_0011bac8;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  local_1d8._M_unused._0_8_ = (undefined8)local_1e0.d;
  local_110.d = (Data *)local_1d8._8_8_;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       operator_new(0x20);
  *(void **)resolver_1.m_d.d = local_1d8._M_unused._M_object;
  if ((Data *)local_1d8._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_1d8._M_unused._0_8_ = *local_1d8._M_unused._M_object + 1;
    UNLOCK();
  }
  ((Data *)resolver_1.m_d.d)->promise = (QPromise<void> *)local_1d8._8_8_;
  if ((PromiseData<int> *)local_1d8._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)local_1d8._8_8_ = *(int *)local_1d8._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver_1.m_d.d + 0x10) = &PTR__QPromiseBase_0011ba98;
  ((Data *)((long)resolver_1.m_d.d + 0x10))->promise = (QPromise<void> *)pPStack_1c0;
  if (pPStack_1c0 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPStack_1c0->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver_1.m_d.d + 0x10) = &PTR__QPromiseBase_0011bac8;
  QtPromisePrivate::
  PromiseHandler<void,QtPromise::QPromiseBase<int>::finally<tst_qpromise_timeout::timeout()::$_1>(tst_qpromise_timeout::timeout()::$_1)const::{lambda()#1}()#1},void>
  ::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromiseBase<int>::finally<tst_qpromise_timeout::timeout()::$_1>(tst_qpromise_timeout::timeout()::$_1)const::{lambda()#1}()#1}const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda()#1}::~function((_lambda___1_ *)&local_1d8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            ((PromiseDataBase<void,_void_()> *)QVar2.d,(function<void_()> *)&resolver_1);
  std::_Function_base::~_Function_base((_Function_base *)&resolver_1);
  QVar2.d = local_1a0.m_d.d;
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_c0,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_1e0,
             (QPromiseResolve<int> *)&local_110,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            ((PromiseDataBase<void,_void_()> *)QVar2.d,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_c0);
  std::_Function_base::~_Function_base((_Function_base *)local_c0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_110);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_118);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_1e0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_1b8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_2.m_d);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bac8;
  bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    ((PromiseDataBase<void,_void_()> *)local_1a0.m_d.d);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              ((PromiseDataBase<void,_void_()> *)local_1a0.m_d.d);
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_1b0);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_1a0);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p_1.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&resolver_3);
  QException::~QException((QException *)&local_a0);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_168);
  local_1b0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011ba98;
  pPVar6 = (PromiseData<int> *)operator_new(0x68);
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0
  ;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar6->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(pPVar6);
  LOCK();
  pQVar1 = &(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar6->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1a0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bac8;
  local_1b0.m_d.d = pPVar6;
  local_1a0.m_d.d = pPVar6;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_3,(QPromise<int> *)&local_1a0);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_1a0);
  QVar2 = p.super_QPromiseBase<int>.m_d;
  if (resolver_3.m_d.d == (Data *)0x0) {
    resolver_3.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  if (resolver_3.m_d.d == (Data *)0x0) {
    local_1e0.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)
             &((Data *)resolver_3.m_d.d)->super_QSharedData)->_vptr_PromiseDataBase =
         *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)
                  &((Data *)resolver_3.m_d.d)->super_QSharedData)->_vptr_PromiseDataBase + 1;
    UNLOCK();
    local_1e0 = resolver_3.m_d.d;
  }
  local_1b8.d = (Data *)0x0;
  local_168._vptr_QPromiseBase = (_func_int **)resolver_3.m_d.d;
  QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_int_&)> *)&local_1d8,
             (PromiseHandler<int,decltype(nullptr),void> *)0x0,&local_168,
             (QPromiseResolve<int> *)&local_1e0,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_1d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
  QVar2 = p.super_QPromiseBase<int>.m_d;
  p_1.super_QPromiseBase<int>._vptr_QPromiseBase = local_168._vptr_QPromiseBase;
  if ((PromiseData<int> *)local_168._vptr_QPromiseBase != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)local_168._vptr_QPromiseBase)->
             _vptr_PromiseDataBase =
         *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)local_168._vptr_QPromiseBase)->
                  _vptr_PromiseDataBase + 1;
    UNLOCK();
  }
  p_1.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)local_1e0.d;
  if ((PromiseData<int> *)local_1e0.d != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)&(local_1e0.d)->super_QSharedData)->
             _vptr_PromiseDataBase =
         *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)&(local_1e0.d)->super_QSharedData)->
                  _vptr_PromiseDataBase + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       operator_new(0x18);
  *(_func_int ***)resolver.m_d.d = p_1.super_QPromiseBase<int>._vptr_QPromiseBase;
  if (p_1.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)p_1.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)p_1.super_QPromiseBase<int>._vptr_QPromiseBase + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<int> *)p_1.super_QPromiseBase<int>.m_d.d;
  if (p_1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)&((p_1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
             _vptr_PromiseDataBase =
         *(int *)&((p_1.super_QPromiseBase<int>.m_d.d)->
                  super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase + 1;
    UNLOCK();
  }
  *(bool **)((long)resolver.m_d.d + 0x10) = &failed;
  QtPromisePrivate::
  PromiseCatcher<int,tst_qpromise_timeout::timeout()::$_2,QtPromise::QPromiseTimeoutException_const&>
  ::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(tst_qpromise_timeout::timeout()::$_2_const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&p_1);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  std::_Function_base::~_Function_base((_Function_base *)&resolver);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_1e0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_1b8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
             &local_168);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_2.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_3.m_d);
  local_1b0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bac8;
  bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  QtPromise::QPromiseBase<int>::wait(&local_50,&local_1b0);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_50);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_1b0);
  p_1.super_QPromiseBase<int>._vptr_QPromiseBase =
       (_func_int **)CONCAT44(p_1.super_QPromiseBase<int>._vptr_QPromiseBase._4_4_,0xffffffff);
  iVar5 = waitForValue<int>(&p,(int *)&p_1);
  cVar4 = QTest::qCompare(iVar5,-1,"waitForValue(p, -1)","-1",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                          ,0x61);
  if (cVar4 != '\0') {
    bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isRejected
                      (&(p.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    p_1.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)CONCAT71(p_1.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,bVar3);
    local_1a0._vptr_QPromiseBase = (_func_int **)CONCAT71(local_1a0._vptr_QPromiseBase._1_7_,1);
    bVar3 = QTest::qCompare<bool,bool>
                      ((bool *)&p_1,(bool *)&local_1a0,"p.isRejected()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                       ,0x62);
    if (bVar3) {
      p_1.super_QPromiseBase<int>._vptr_QPromiseBase =
           (_func_int **)CONCAT71(p_1.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,1);
      bVar3 = QTest::qCompare<bool,bool>
                        (&failed,(bool *)&p_1,"failed","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                         ,99);
      if (bVar3) {
        cVar4 = QTest::qVerify(0x757 < elapsed,"elapsed >= static_cast<qint64>(2000 * 0.94)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                               ,0x68);
        if (cVar4 != '\0') {
          QTest::qVerify(elapsed < 0x849,"elapsed <= static_cast<qint64>(2000 * 1.06)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                         ,0x69);
        }
      }
    }
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p.super_QPromiseBase<int>);
  return;
}

Assistant:

void tst_qpromise_timeout::timeout()
{
    QElapsedTimer timer;
    qint64 elapsed = -1;
    bool failed = false;

    timer.start();

    auto p = QtPromise::QPromise<int>{[](const QtPromise::QPromiseResolve<int>& resolve) {
                 QTimer::singleShot(4000, [=]() {
                     resolve(42);
                 });
             }}.timeout(2000)
                 .finally([&]() {
                     elapsed = timer.elapsed();
                 });

    p.fail([&](const QtPromise::QPromiseTimeoutException&) {
         failed = true;
         return -1;
     }).wait();

    QCOMPARE(waitForValue(p, -1), -1);
    QCOMPARE(p.isRejected(), true);
    QCOMPARE(failed, true);

    // Qt::CoarseTimer (default) Coarse timers try to
    // keep accuracy within 5% of the desired interval.
    // Require accuracy within 6% for passing the test.
    QVERIFY(elapsed >= static_cast<qint64>(2000 * 0.94));
    QVERIFY(elapsed <= static_cast<qint64>(2000 * 1.06));
}